

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_array_cmp_generic(void *a,void *b,void *opaque)

{
  JSContext *ctx;
  JSValue new_target;
  int val;
  int iVar1;
  void *pvVar2;
  uint uVar3;
  JSValueUnion JVar4;
  undefined1 auVar5 [16];
  JSValue JVar6;
  JSValue argv [2];
  undefined4 local_58;
  uint uStack_54;
  undefined8 uStack_50;
  JSValueUnion local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (*(int *)((long)opaque + 8) != 0) {
    return 0;
  }
  ctx = *opaque;
  if (*(int *)((long)opaque + 0xc) == 0) {
    JVar4 = (JSValueUnion)((JSValueUnion *)((long)a + 0x10))->ptr;
    pvVar2 = opaque;
    if ((JSContext *)JVar4.ptr == (JSContext *)0x0) {
      JVar6 = JS_ToStringInternal(ctx,*a,0);
      pvVar2 = (void *)JVar6.tag;
      JVar4 = JVar6.u;
      if ((int)JVar6.tag == 6) goto LAB_001643ec;
      ((JSValueUnion *)((long)a + 0x10))->ptr = (void *)JVar4;
    }
    JVar6.tag = (int64_t)pvVar2;
    JVar6.u.ptr = ((JSValueUnion *)((long)b + 0x10))->ptr;
    if (((JSValueUnion *)((long)b + 0x10))->ptr == (void *)0x0) {
      JVar6 = JS_ToStringInternal(ctx,*b,0);
      if ((int)JVar6.tag == 6) goto LAB_001643ec;
      *(JSValueUnion *)((long)b + 0x10) = JVar6.u;
      JVar4 = (JSValueUnion)((JSValueUnion *)((long)a + 0x10))->ptr;
    }
    uVar3 = js_string_compare((JSContext *)JVar4.ptr,(JSString *)JVar6.u.ptr,(JSString *)JVar6.tag);
  }
  else {
    auVar5[0] = -(*b == *a);
    auVar5[1] = -(*(char *)((long)b + 1) == *(char *)((long)a + 1));
    auVar5[2] = -(*(char *)((long)b + 2) == *(char *)((long)a + 2));
    auVar5[3] = -(*(char *)((long)b + 3) == *(char *)((long)a + 3));
    auVar5[4] = -(*(char *)((long)b + 4) == *(char *)((long)a + 4));
    auVar5[5] = -(*(char *)((long)b + 5) == *(char *)((long)a + 5));
    auVar5[6] = -(*(char *)((long)b + 6) == *(char *)((long)a + 6));
    auVar5[7] = -(*(char *)((long)b + 7) == *(char *)((long)a + 7));
    auVar5[8] = -(*(char *)((long)b + 8) == *(char *)((long)a + 8));
    auVar5[9] = -(*(char *)((long)b + 9) == *(char *)((long)a + 9));
    auVar5[10] = -(*(char *)((long)b + 10) == *(char *)((long)a + 10));
    auVar5[0xb] = -(*(char *)((long)b + 0xb) == *(char *)((long)a + 0xb));
    auVar5[0xc] = -(*(char *)((long)b + 0xc) == *(char *)((long)a + 0xc));
    auVar5[0xd] = -(*(char *)((long)b + 0xd) == *(char *)((long)a + 0xd));
    auVar5[0xe] = -(*(char *)((long)b + 0xe) == *(char *)((long)a + 0xe));
    auVar5[0xf] = -(*(char *)((long)b + 0xf) == *(char *)((long)a + 0xf));
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf)
        == 0xffff) goto LAB_0016445b;
    local_48 = *a;
    uStack_40 = *(undefined8 *)((long)a + 8);
    local_38 = *b;
    uStack_30 = *(undefined8 *)((long)b + 8);
    local_58 = 0;
    uStack_50 = 3;
    new_target.tag = 3;
    new_target.u.ptr = (void *)((ulong)uStack_54 << 0x20);
    JVar6 = JS_CallInternal(ctx,*(JSValue *)((long)opaque + 0x10),(JSValue)(ZEXT816(3) << 0x40),
                            new_target,2,(JSValue *)&local_48,2);
    JVar4 = JVar6.u;
    uVar3 = (uint)JVar6.tag;
    if (uVar3 == 6) {
LAB_001643ec:
      *(undefined4 *)((long)opaque + 8) = 1;
      return 0;
    }
    iVar1 = JVar6.u._0_4_;
    if (uVar3 == 0) {
      uVar3 = (uint)(iVar1 != 0) | iVar1 >> 0x1f;
    }
    else {
      if (uVar3 < 3) {
        JVar4.float64 = (double)iVar1;
      }
      else if (uVar3 != 7) {
        iVar1 = __JS_ToFloat64Free(ctx,(double *)&local_58,JVar6);
        if (iVar1 < 0) goto LAB_001643ec;
        JVar4._4_4_ = uStack_54;
        JVar4.int32 = local_58;
      }
      uVar3 = (uint)(0.0 < JVar4.float64) - (uint)(JVar4.float64 < 0.0);
    }
  }
  if (uVar3 != 0) {
    return uVar3;
  }
LAB_0016445b:
  return (uint)(*(long *)((long)b + 0x18) < *(long *)((long)a + 0x18)) -
         (uint)(*(long *)((long)a + 0x18) < *(long *)((long)b + 0x18));
}

Assistant:

static int js_array_cmp_generic(const void *a, const void *b, void *opaque) {
    struct array_sort_context *psc = opaque;
    JSContext *ctx = psc->ctx;
    JSValueConst argv[2];
    JSValue res;
    ValueSlot *ap = (ValueSlot *)(void *)a;
    ValueSlot *bp = (ValueSlot *)(void *)b;
    int cmp;

    if (psc->exception)
        return 0;

    if (psc->has_method) {
        /* custom sort function is specified as returning 0 for identical
         * objects: avoid method call overhead.
         */
        if (!memcmp(&ap->val, &bp->val, sizeof(ap->val)))
            goto cmp_same;
        argv[0] = ap->val;
        argv[1] = bp->val;
        res = JS_Call(ctx, psc->method, JS_UNDEFINED, 2, argv);
        if (JS_IsException(res))
            goto exception;
        if (JS_VALUE_GET_TAG(res) == JS_TAG_INT) {
            int val = JS_VALUE_GET_INT(res);
            cmp = (val > 0) - (val < 0);
        } else {
            double val;
            if (JS_ToFloat64Free(ctx, &val, res) < 0)
                goto exception;
            cmp = (val > 0) - (val < 0);
        }
    } else {
        /* Not supposed to bypass ToString even for identical objects as
         * tested in test262/test/built-ins/Array/prototype/sort/bug_596_1.js
         */
        if (!ap->str) {
            JSValue str = JS_ToString(ctx, ap->val);
            if (JS_IsException(str))
                goto exception;
            ap->str = JS_VALUE_GET_STRING(str);
        }
        if (!bp->str) {
            JSValue str = JS_ToString(ctx, bp->val);
            if (JS_IsException(str))
                goto exception;
            bp->str = JS_VALUE_GET_STRING(str);
        }
        cmp = js_string_compare(ctx, ap->str, bp->str);
    }
    if (cmp != 0)
        return cmp;
cmp_same:
    /* make sort stable: compare array offsets */
    return (ap->pos > bp->pos) - (ap->pos < bp->pos);

exception:
    psc->exception = 1;
    return 0;
}